

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O3

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<28U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  size_type new_capacity;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&this->_union + 0x10) = 0;
  *(undefined8 *)((long)&this->_union + 0x18) = 0;
  (this->_union).indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&this->_union + 8) = 0;
  uVar2 = other->_size;
  new_capacity = uVar2 - 0x1d;
  if (uVar2 < 0x1d) {
    new_capacity = uVar2;
  }
  change_capacity(this,new_capacity);
  uVar4 = new_capacity + this->_size;
  this->_size = uVar4;
  uVar2 = other->_size;
  if (0x1c < uVar2) {
    other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (other->_union).indirect_contents.indirect;
    uVar2 = uVar2 - 0x1d;
  }
  if (uVar2 != 0) {
    if (0x1c < uVar4) {
      this = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    }
    lVar3 = 0;
    do {
      (this->_union).direct[lVar3] = (other->_union).direct[lVar3];
      lVar3 = lVar3 + 1;
    } while ((int)uVar2 != lVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

prevector(const prevector<N, T, Size, Diff>& other) {
        size_type n = other.size();
        change_capacity(n);
        _size += n;
        fill(item_ptr(0), other.begin(),  other.end());
    }